

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.h
# Opt level: O2

etc1_solution_coordinates * __thiscall
crnlib::etc1_solution_coordinates::operator=
          (etc1_solution_coordinates *this,etc1_solution_coordinates *rhs)

{
  (this->m_unscaled_color).field_0.field_0.r = (rhs->m_unscaled_color).field_0.field_0.r;
  (this->m_unscaled_color).field_0.field_0.g = (rhs->m_unscaled_color).field_0.field_0.g;
  (this->m_unscaled_color).field_0.field_0.b = (rhs->m_unscaled_color).field_0.field_0.b;
  (this->m_unscaled_color).field_0.field_0.a = (rhs->m_unscaled_color).field_0.field_0.a;
  this->m_inten_table = rhs->m_inten_table;
  this->m_color4 = rhs->m_color4;
  return this;
}

Assistant:

inline etc1_solution_coordinates& operator=(const etc1_solution_coordinates& rhs)
        {
            m_unscaled_color = rhs.m_unscaled_color;
            m_inten_table = rhs.m_inten_table;
            m_color4 = rhs.m_color4;
            return *this;
        }